

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_string_field.h
# Opt level: O1

void __thiscall
google::protobuf::internal::InlinedStringField::SetAllocated
          (InlinedStringField *this,string *default_value,string *value,Arena *arena,bool donated,
          uint32_t *donating_states,uint32_t mask,MessageLite *msg)

{
  pointer pcVar1;
  
  if (value != (string *)0x0) {
    std::__cxx11::string::operator=((string *)this,(string *)value);
    pcVar1 = (value->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 != &value->field_2) {
      operator_delete(pcVar1,(value->field_2)._M_allocated_capacity + 1);
    }
    operator_delete(value,0x20);
    return;
  }
  (this->field_0).str_._M_string_length = 0;
  **(undefined1 **)&this->field_0 = 0;
  return;
}

Assistant:

inline void InlinedStringField::SetAllocatedNoArena(
    const std::string* /*default_value*/, std::string* value) {
  if (value == nullptr) {
    // Currently, inlined string field can't have non empty default.
    get_mutable()->clear();
  } else {
    get_mutable()->assign(std::move(*value));
    delete value;
  }
}